

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O2

void __thiscall
dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
          (LLVMControlDependenceAnalysis *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts,LLVMPointerAnalysis *pta)

{
  this->_module = module;
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(&this->_options,opts);
  (this->_impl)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (LLVMControlDependenceAnalysisImpl *)0x0;
  (this->_interprocImpl)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (LLVMControlDependenceAnalysisImpl *)0x0;
  dg::LLVMControlDependenceAnalysis::initializeImpl((LLVMPointerAnalysis *)this,(CallGraph *)pta);
  return;
}

Assistant:

LLVMControlDependenceAnalysis(const llvm::Module *module,
                                  LLVMControlDependenceAnalysisOptions opts,
                                  LLVMPointerAnalysis *pta = nullptr)
            : _module(module), _options(std::move(opts)) {
        initializeImpl(pta);
    }